

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_measures.cc
# Opt level: O1

int S2::GetNumPoints(S2ShapeIndex *index)

{
  int iVar1;
  long *plVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  undefined4 extraout_var;
  
  iVar1 = (*index->_vptr_S2ShapeIndex[2])();
  iVar3 = 0;
  if (0 < iVar1) {
    uVar5 = 0;
    do {
      iVar1 = (*index->_vptr_S2ShapeIndex[3])(index,uVar5);
      plVar2 = (long *)CONCAT44(extraout_var,iVar1);
      if (plVar2 != (long *)0x0) {
        iVar1 = (**(code **)(*plVar2 + 0x20))(plVar2);
        if (iVar1 == 0) {
          iVar1 = (**(code **)(*plVar2 + 0x10))(plVar2);
          iVar3 = iVar3 + iVar1;
        }
      }
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
      iVar1 = (*index->_vptr_S2ShapeIndex[2])(index);
    } while ((int)uVar4 < iVar1);
  }
  return iVar3;
}

Assistant:

int GetNumPoints(const S2ShapeIndex& index) {
  int count = 0;
  for (int i = 0; i < index.num_shape_ids(); ++i) {
    S2Shape* shape = index.shape(i);
    if (shape && shape->dimension() == 0) {
      count += shape->num_edges();
    }
  }
  return count;
}